

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar_helper.h
# Opt level: O2

date_time date::calendar_helper::from_seconds_count(seconds_count seconds)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  uint uVar9;
  
  lVar8 = (seconds / 0x15180) * 100;
  uVar7 = lVar8 + 0x776f;
  lVar6 = uVar7 / 0x37bb49 - uVar7 / 0xdeed24;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = lVar6 * 100 + lVar8 + 0x776f;
  uVar7 = SUB168(auVar1 / ZEXT816(0x8ead),0) & 0xffff;
  lVar6 = (uVar7 * -0x16d + seconds / 0x15180 + lVar6) - (uVar7 >> 2);
  uVar7 = lVar6 * 5 + 0x7c2;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar7;
  uVar4 = SUB164(auVar2 / ZEXT816(0x99),0);
  uVar9 = uVar4 + 0xf4;
  if (uVar7 < 0x7c5) {
    uVar9 = uVar4;
  }
  uVar5 = (seconds % 0x15180) % 0xe10;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = uVar5;
  return (date_time)
         ((SUB168(auVar3 / ZEXT816(0x3c),0) & 0xff) << 0x28 | (seconds % 0x15180) / 0xe10 << 0x20 |
          ((ulong)(uint)((int)uVar5 + SUB164(auVar3 / ZEXT816(0x3c),0) * 0xc4) & 0xff) << 0x30 |
          (ulong)((SUB164(auVar1 / ZEXT816(0x8ead),0) + 1) - (uint)(uVar7 < 0x7c5) & 0xffff) |
          (ulong)((uVar9 & 0xff) << 0x10) |
         (ulong)(((int)lVar6 - (int)((SUB168(auVar2 / ZEXT816(0x99),0) * 0x99 - 0x1c9U) / 5)) *
                 0x1000000 + 0x32000000));
}

Assistant:

static date_time from_seconds_count(seconds_count seconds)
    {
        const seconds_count days_count = seconds / (24 * 60 * 60);
        const seconds_count z = days_count + 306;
        const seconds_count h = 100 * z - 25;
        const seconds_count a = h / 3652425;
        const seconds_count b = a - a / 4;
        const seconds_count y = static_cast<year_type>((100 * b + h) / 36525);
        const seconds_count c = b + z - 365 * y - y / 4;
        const seconds_count m = (5 * c + 456) / 153;
        const auto day   = static_cast<day_type>(c - (153 * m - 457) / 5);
        const auto month = static_cast<month_type>(m - (m > 12 ? 12 : 0));
        const auto year  = static_cast<year_type>(y + (m > 12 ? 1 : 0));
        auto seconds_rest = seconds - days_count * (24 * 60 * 60);
        const auto hour = static_cast<hour_type>(seconds_rest / (60 * 60));
        seconds_rest -= hour * (60 * 60);
        const auto minute = static_cast<minute_type>(seconds_rest / 60);
        const auto second = static_cast<second_type>(seconds_rest - minute * 60);
        return date_time{ year, month, day, hour, minute, second };
    }